

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::uDot(Forth *this)

{
  Cell CVar1;
  ostream *poVar2;
  
  requireDStackDepth(this,1,"U.");
  ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (this->writeToTarget == ToStdCout) {
    CVar1 = getNumericBase(this);
    poVar2 = std::operator<<(&std::cout,CVar1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    std::ostream::flush();
    return;
  }
  if (this->writeToTarget == ToString) {
    CVar1 = getNumericBase(this);
    poVar2 = std::operator<<(&this->field_0x20,CVar1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    return;
  }
  return;
}

Assistant:

void uDot() {
			REQUIRE_DSTACK_DEPTH(1, "U.");
			auto value = static_cast<Cell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << value << " ";
				break;
			case ToStdCout:
				std::cout << SETBASE() << value << " ";
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}